

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_client_key_exchange(mbedtls_ssl_context *ssl)

{
  size_t sVar1;
  uchar *puVar2;
  uchar *end;
  uchar *p;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  p = (uchar *)ssl->transform_negotiate->ciphersuite_info;
  pmStack_18 = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0xc3c,"=> parse client key exchange");
  ciphersuite_info._4_4_ = mbedtls_ssl_read_record(pmStack_18);
  if (ciphersuite_info._4_4_ == 0) {
    puVar2 = pmStack_18->in_msg;
    sVar1 = mbedtls_ssl_hs_hdr_len(pmStack_18);
    end = puVar2 + sVar1;
    puVar2 = pmStack_18->in_msg + pmStack_18->in_hslen;
    if (pmStack_18->in_msgtype == 0x16) {
      if (*pmStack_18->in_msg == '\x10') {
        if (*(int *)(p + 0x18) == 2) {
          ciphersuite_info._4_4_ = ssl_parse_client_dh_public(pmStack_18,&end,puVar2);
          if (ciphersuite_info._4_4_ != 0) {
            mbedtls_debug_print_ret
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0xc58,"ssl_parse_client_dh_public",ciphersuite_info._4_4_);
            return ciphersuite_info._4_4_;
          }
          if (end != puVar2) {
            mbedtls_debug_print_msg
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0xc5e,"bad client key exchange");
            return -0x7c00;
          }
          ciphersuite_info._4_4_ =
               mbedtls_dhm_calc_secret
                         (&pmStack_18->handshake->dhm_ctx,pmStack_18->handshake->premaster,0x424,
                          &pmStack_18->handshake->pmslen,pmStack_18->conf->f_rng,
                          pmStack_18->conf->p_rng);
          if (ciphersuite_info._4_4_ != 0) {
            mbedtls_debug_print_ret
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0xc68,"mbedtls_dhm_calc_secret",ciphersuite_info._4_4_);
            return -32000;
          }
          mbedtls_debug_print_mpi
                    (pmStack_18,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0xc6c,"DHM: K ",&(pmStack_18->handshake->dhm_ctx).K);
        }
        else if ((((*(int *)(p + 0x18) == 3) || (*(int *)(p + 0x18) == 4)) ||
                 (*(int *)(p + 0x18) == 9)) || (*(int *)(p + 0x18) == 10)) {
          ciphersuite_info._4_4_ =
               mbedtls_ecdh_read_public
                         (&pmStack_18->handshake->ecdh_ctx,end,(long)puVar2 - (long)end);
          if (ciphersuite_info._4_4_ != 0) {
            mbedtls_debug_print_ret
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0xc7c,"mbedtls_ecdh_read_public",ciphersuite_info._4_4_);
            return -0x7c80;
          }
          mbedtls_debug_print_ecp
                    (pmStack_18,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0xc80,"ECDH: Qp ",&(pmStack_18->handshake->ecdh_ctx).Qp);
          ciphersuite_info._4_4_ =
               mbedtls_ecdh_calc_secret
                         (&pmStack_18->handshake->ecdh_ctx,&pmStack_18->handshake->pmslen,
                          pmStack_18->handshake->premaster,0x400,pmStack_18->conf->f_rng,
                          pmStack_18->conf->p_rng);
          if (ciphersuite_info._4_4_ != 0) {
            mbedtls_debug_print_ret
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0xc88,"mbedtls_ecdh_calc_secret",ciphersuite_info._4_4_);
            return -32000;
          }
          mbedtls_debug_print_mpi
                    (pmStack_18,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0xc8c,"ECDH: z  ",&(pmStack_18->handshake->ecdh_ctx).z);
        }
        else {
          if (*(int *)(p + 0x18) == 5) {
            ciphersuite_info._4_4_ = ssl_parse_client_psk_identity(pmStack_18,&end,puVar2);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xc98,"ssl_parse_client_psk_identity",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
            if (end != puVar2) {
              mbedtls_debug_print_msg
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xc9e,"bad client key exchange");
              return -0x7c00;
            }
            ciphersuite_info._4_4_ =
                 mbedtls_ssl_psk_derive_premaster
                           (pmStack_18,*(mbedtls_key_exchange_type_t *)(p + 0x18));
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xca5,"mbedtls_ssl_psk_derive_premaster",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
          }
          else if (*(int *)(p + 0x18) == 7) {
            ciphersuite_info._4_4_ = ssl_parse_client_psk_identity(pmStack_18,&end,puVar2);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xcb0,"ssl_parse_client_psk_identity",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
            ciphersuite_info._4_4_ = ssl_parse_encrypted_pms(pmStack_18,end,puVar2,2);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xcb6,"ssl_parse_encrypted_pms",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
            ciphersuite_info._4_4_ =
                 mbedtls_ssl_psk_derive_premaster
                           (pmStack_18,*(mbedtls_key_exchange_type_t *)(p + 0x18));
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xcbd,"mbedtls_ssl_psk_derive_premaster",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
          }
          else if (*(int *)(p + 0x18) == 6) {
            ciphersuite_info._4_4_ = ssl_parse_client_psk_identity(pmStack_18,&end,puVar2);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xcc8,"ssl_parse_client_psk_identity",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
            ciphersuite_info._4_4_ = ssl_parse_client_dh_public(pmStack_18,&end,puVar2);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xccd,"ssl_parse_client_dh_public",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
            if (end != puVar2) {
              mbedtls_debug_print_msg
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xcd3,"bad client key exchange");
              return -0x7c00;
            }
            ciphersuite_info._4_4_ =
                 mbedtls_ssl_psk_derive_premaster
                           (pmStack_18,*(mbedtls_key_exchange_type_t *)(p + 0x18));
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xcda,"mbedtls_ssl_psk_derive_premaster",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
          }
          else if (*(int *)(p + 0x18) == 8) {
            ciphersuite_info._4_4_ = ssl_parse_client_psk_identity(pmStack_18,&end,puVar2);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xce5,"ssl_parse_client_psk_identity",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
            ciphersuite_info._4_4_ =
                 mbedtls_ecdh_read_public
                           (&pmStack_18->handshake->ecdh_ctx,end,(long)puVar2 - (long)end);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xcec,"mbedtls_ecdh_read_public",ciphersuite_info._4_4_);
              return -0x7c80;
            }
            mbedtls_debug_print_ecp
                      (pmStack_18,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0xcf0,"ECDH: Qp ",&(pmStack_18->handshake->ecdh_ctx).Qp);
            ciphersuite_info._4_4_ =
                 mbedtls_ssl_psk_derive_premaster
                           (pmStack_18,*(mbedtls_key_exchange_type_t *)(p + 0x18));
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xcf5,"mbedtls_ssl_psk_derive_premaster",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
          }
          else {
            if (*(int *)(p + 0x18) != 1) {
              mbedtls_debug_print_msg
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xd07,"should never happen");
              return -0x6c00;
            }
            ciphersuite_info._4_4_ = ssl_parse_encrypted_pms(pmStack_18,end,puVar2,0);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                         ,0xd00,"ssl_parse_parse_encrypted_pms_secret",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
          }
          ciphersuite_info._4_4_ = 0;
        }
        ciphersuite_info._4_4_ = mbedtls_ssl_derive_keys(pmStack_18);
        if (ciphersuite_info._4_4_ == 0) {
          pmStack_18->state = pmStack_18->state + 1;
          mbedtls_debug_print_msg
                    (pmStack_18,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0xd13,"<= parse client key exchange");
          ssl_local._4_4_ = 0;
        }
        else {
          mbedtls_debug_print_ret
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0xd0d,"mbedtls_ssl_derive_keys",ciphersuite_info._4_4_);
          ssl_local._4_4_ = ciphersuite_info._4_4_;
        }
      }
      else {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0xc4f,"bad client key exchange message");
        ssl_local._4_4_ = -0x7c00;
      }
    }
    else {
      mbedtls_debug_print_msg
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xc49,"bad client key exchange message");
      ssl_local._4_4_ = -0x7c00;
    }
  }
  else {
    mbedtls_debug_print_ret
              (pmStack_18,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xc40,"mbedtls_ssl_read_record",ciphersuite_info._4_4_);
    ssl_local._4_4_ = ciphersuite_info._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_client_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info;
    unsigned char *p, *end;

    ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse client key exchange" ) );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    p = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
    end = ssl->in_msg + ssl->in_hslen;

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_CLIENT_KEY_EXCHANGE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA )
    {
        if( ( ret = ssl_parse_client_dh_public( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_dh_public" ), ret );
            return( ret );
        }

        if( p != end )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
        }

        if( ( ret = mbedtls_dhm_calc_secret( &ssl->handshake->dhm_ctx,
                                      ssl->handshake->premaster,
                                      MBEDTLS_PREMASTER_SIZE,
                                     &ssl->handshake->pmslen,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_calc_secret", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_CS );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: K ", &ssl->handshake->dhm_ctx.K  );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED) ||                   \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) ||                      \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        if( ( ret = mbedtls_ecdh_read_public( &ssl->handshake->ecdh_ctx,
                                      p, end - p) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_read_public", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP );
        }

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Qp ", &ssl->handshake->ecdh_ctx.Qp );

        if( ( ret = mbedtls_ecdh_calc_secret( &ssl->handshake->ecdh_ctx,
                                      &ssl->handshake->pmslen,
                                       ssl->handshake->premaster,
                                       MBEDTLS_MPI_MAX_SIZE,
                                       ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_calc_secret", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_CS );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "ECDH: z  ", &ssl->handshake->ecdh_ctx.z );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK )
    {
        if( ( ret = ssl_parse_client_psk_identity( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_psk_identity" ), ret );
            return( ret );
        }

        if( p != end )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
        }

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        if( ( ret = ssl_parse_client_psk_identity( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_psk_identity" ), ret );
            return( ret );
        }

        if( ( ret = ssl_parse_encrypted_pms( ssl, p, end, 2 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_encrypted_pms" ), ret );
            return( ret );
        }

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ( ret = ssl_parse_client_psk_identity( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_psk_identity" ), ret );
            return( ret );
        }
        if( ( ret = ssl_parse_client_dh_public( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_dh_public" ), ret );
            return( ret );
        }

        if( p != end )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
        }

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        if( ( ret = ssl_parse_client_psk_identity( ssl, &p, end ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_client_psk_identity" ), ret );
            return( ret );
        }

        if( ( ret = mbedtls_ecdh_read_public( &ssl->handshake->ecdh_ctx,
                                       p, end - p ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_read_public", ret );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP );
        }

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Qp ", &ssl->handshake->ecdh_ctx.Qp );

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA )
    {
        if( ( ret = ssl_parse_encrypted_pms( ssl, p, end, 0 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "ssl_parse_parse_encrypted_pms_secret" ), ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    if( ( ret = mbedtls_ssl_derive_keys( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_derive_keys", ret );
        return( ret );
    }

    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse client key exchange" ) );

    return( 0 );
}